

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O0

int __thiscall smf::Binasc::processMidiTempoWord(Binasc *this,ostream *out,string *word,int lineNum)

{
  int iVar1;
  ulong uVar2;
  ostream *poVar3;
  char *pcVar4;
  uchar byte2;
  uchar byte1;
  uchar byte0;
  double dStack_38;
  int intval;
  double value;
  int lineNum_local;
  string *word_local;
  ostream *out_local;
  Binasc *this_local;
  
  uVar2 = std::__cxx11::string::size();
  if (uVar2 < 2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error on line: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,lineNum);
    poVar3 = std::operator<<(poVar3,": \'t\' needs to be followed immediately by ");
    poVar3 = std::operator<<(poVar3,"a floating-point number");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this_local._4_4_ = 0;
  }
  else {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)word);
    iVar1 = isdigit((int)*pcVar4);
    if ((((iVar1 == 0) &&
         (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)word), *pcVar4 != '.')) &&
        (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)word), *pcVar4 != '-')) &&
       (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)word), *pcVar4 != '+')) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error on line: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,lineNum);
      poVar3 = std::operator<<(poVar3,": \'t\' needs to be followed immediately by ");
      poVar3 = std::operator<<(poVar3,"a floating-point number");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      return 0;
    }
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)word);
    dStack_38 = strtod(pcVar4,(char **)0x0);
    if (dStack_38 < 0.0) {
      dStack_38 = -dStack_38;
    }
    iVar1 = (int)(60000000.0 / dStack_38 + 0.5);
    poVar3 = std::operator<<(out,(uchar)((uint)iVar1 >> 0x10));
    poVar3 = std::operator<<(poVar3,(uchar)((uint)iVar1 >> 8));
    std::operator<<(poVar3,(uchar)iVar1);
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int Binasc::processMidiTempoWord(std::ostream& out, const std::string& word,
		int lineNum) {
	if (word.size() < 2) {
		std::cerr << "Error on line: " << lineNum
			  << ": 't' needs to be followed immediately by "
			  << "a floating-point number" << std::endl;
		return 0;
	}
	if (!(isdigit(word[1]) || word[1] == '.' || word[1] == '-'
			|| word[1] == '+')) {
		std::cerr << "Error on line: " << lineNum
			  << ": 't' needs to be followed immediately by "
			  << "a floating-point number" << std::endl;
		return 0;
	}
	double value = strtod(&word[1], NULL);

	if (value < 0.0) {
		value = -value;
	}

	int intval = int(60.0 * 1000000.0 / value + 0.5);

	uchar byte0 = intval & 0xff;
	uchar byte1 = (intval >>  8) & 0xff;
	uchar byte2 = (intval >> 16) & 0xff;
	out << byte2 << byte1 << byte0;
	return 1;
}